

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

void Cmd_listsoundchannels(FCommandLine *argv,APlayerPawn *who,int key)

{
  AActor *actor;
  long lVar1;
  uint uVar2;
  char *pcVar3;
  FSoundChan *pFVar4;
  FVector3 chanorigin;
  
  uVar2 = 0;
  if (Channels != (FSoundChan *)0x0) {
    pFVar4 = Channels;
    do {
      if ((pFVar4->ChanFlags & 2U) == 0) {
        actor = (pFVar4->field_12).Actor;
        CalcPosVel((uint)pFVar4->SourceType,actor,(sector_t *)actor,(FPolyObj *)actor,
                   (pFVar4->field_12).Point,(uint)pFVar4->EntChannel,pFVar4->ChanFlags,&chanorigin,
                   (FVector3 *)0x0);
        lVar1 = (long)(pFVar4->SoundID).ID;
        if (lVar1 == 0) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = S_sfx.Array[lVar1].name.Chars;
        }
        Printf("%s at (%1.5f, %1.5f, %1.5f)\n",(double)chanorigin.X,(double)chanorigin.Y,
               (double)chanorigin.Z,pcVar3);
        uVar2 = uVar2 + 1;
      }
      pFVar4 = pFVar4->NextChan;
    } while (pFVar4 != (FSoundChan *)0x0);
  }
  Printf("%d sounds playing\n",(ulong)uVar2);
  return;
}

Assistant:

CCMD(listsoundchannels)
{	
	FSoundChan *chan;
	int count = 0;
	for (chan = Channels; chan != NULL; chan = chan->NextChan)
	{
		if (!(chan->ChanFlags & CHAN_EVICTED))
		{
			FVector3 chanorigin;

			CalcPosVel(chan, &chanorigin, NULL);

			Printf("%s at (%1.5f, %1.5f, %1.5f)\n", (const char*)chan->SoundID, chanorigin.X, chanorigin.Y, chanorigin.Z);
			count++;
		}
	}
	Printf("%d sounds playing\n", count);
}